

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatclient.cpp
# Opt level: O0

void __thiscall ChatClient::ChatClient(ChatClient *this,QObject *parent)

{
  QTcpSocket *this_00;
  ConnectionType type;
  Object local_d0 [8];
  code *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 local_b0;
  Object local_a8 [8];
  code *local_a0;
  undefined8 uStack_98;
  code *local_90;
  undefined8 local_88;
  Object local_80 [8];
  code *local_78;
  undefined8 uStack_70;
  code *local_68;
  undefined8 local_60;
  Object local_58 [8];
  code *local_50;
  undefined8 uStack_48;
  code *local_40;
  undefined8 local_38;
  Object local_30 [24];
  QObject *local_18;
  QObject *parent_local;
  ChatClient *this_local;
  
  local_18 = parent;
  parent_local = &this->super_QObject;
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_001169d0;
  this_00 = (QTcpSocket *)operator_new(0x10);
  QTcpSocket::QTcpSocket(this_00,&this->super_QObject);
  this->m_clientSocket = this_00;
  this->m_loggedIn = false;
  local_40 = QAbstractSocket::connected;
  local_38 = 0;
  local_50 = connected;
  uStack_48 = 0;
  type = (ConnectionType)this;
  QObject::connect<void(QAbstractSocket::*)(),void(ChatClient::*)()>
            (local_30,(offset_in_QAbstractSocket_to_subr)this->m_clientSocket,
             (Object *)QAbstractSocket::connected,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  local_68 = QAbstractSocket::disconnected;
  local_60 = 0;
  local_78 = disconnected;
  uStack_70 = 0;
  QObject::connect<void(QAbstractSocket::*)(),void(ChatClient::*)()>
            (local_58,(offset_in_QAbstractSocket_to_subr)this->m_clientSocket,
             (Object *)QAbstractSocket::disconnected,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  local_90 = QIODevice::readyRead;
  local_88 = 0;
  local_a0 = onReadyRead;
  uStack_98 = 0;
  QObject::connect<void(QIODevice::*)(),void(ChatClient::*)()>
            (local_80,(offset_in_QIODevice_to_subr)this->m_clientSocket,
             (Object *)QIODevice::readyRead,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  local_b8 = QAbstractSocket::errorOccurred;
  local_b0 = 0;
  local_c8 = error;
  uStack_c0 = 0;
  QObject::
  connect<void(QAbstractSocket::*)(QAbstractSocket::SocketError),void(ChatClient::*)(QAbstractSocket::SocketError)>
            (local_a8,(offset_in_QAbstractSocket_to_subr)this->m_clientSocket,
             (Object *)QAbstractSocket::errorOccurred,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  QObject::connect<void(QAbstractSocket::*)(),ChatClient::ChatClient(QObject*)::__0>
            (local_d0,(offset_in_QAbstractSocket_to_subr)this->m_clientSocket,
             (QObject *)QAbstractSocket::disconnected,(anon_class_8_1_8991fb9c_for_function)0x0,type
            );
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  return;
}

Assistant:

ChatClient::ChatClient(QObject *parent)
    : QObject(parent)
    , m_clientSocket(new QTcpSocket(this))
    , m_loggedIn(false)
{
    // Forward the connected and disconnected signals
    connect(m_clientSocket, &QTcpSocket::connected, this, &ChatClient::connected);
    connect(m_clientSocket, &QTcpSocket::disconnected, this, &ChatClient::disconnected);
    // connect readyRead() to the slot that will take care of reading the data in
    connect(m_clientSocket, &QTcpSocket::readyRead, this, &ChatClient::onReadyRead);
    // Forward the error signal, QOverload is necessary as error() is overloaded, see the Qt docs 
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    connect(m_clientSocket, QOverload<QAbstractSocket::SocketError>::of(&QAbstractSocket::error), this, &ChatClient::error);
#else
    connect(m_clientSocket, &QAbstractSocket::errorOccurred, this, &ChatClient::error);
#endif
    // Reset the m_loggedIn variable when we disconnec. Since the operation is trivial we use a lambda instead of creating another slot
    connect(m_clientSocket, &QTcpSocket::disconnected, this, [this]()->void{m_loggedIn = false;});
}